

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O3

bool lsim::load_logisim(LSimContext *lsim_context,char *data,size_t len)

{
  bool bVar1;
  xml_parse_result result;
  xml_document xml_doc;
  LogisimParser parser;
  xml_parse_result xStack_278;
  xml_document local_260;
  LogisimParser local_190;
  
  pugi::xml_document::xml_document(&local_260);
  pugi::xml_document::load_buffer(&xStack_278,&local_260,data,len,0x74,encoding_auto);
  bVar1 = pugi::xml_parse_result::operator_cast_to_bool(&xStack_278);
  if (bVar1) {
    anon_unknown.dwarf_25fcf1::LogisimParser::LogisimParser(&local_190,&local_260,lsim_context);
    bVar1 = anon_unknown.dwarf_25fcf1::LogisimParser::parse_xml(&local_190);
    anon_unknown.dwarf_25fcf1::LogisimParser::~LogisimParser(&local_190);
  }
  else {
    bVar1 = false;
  }
  pugi::xml_document::~xml_document(&local_260);
  return bVar1;
}

Assistant:

bool load_logisim(LSimContext *lsim_context, const char *data, size_t len) {
    pugi::xml_document xml_doc;

    auto result = xml_doc.load_buffer(data, len);
    if (!result) {
        return false;
    }

    auto parser = LogisimParser(&xml_doc, lsim_context);
    return parser.parse_xml();
}